

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  re_registers *in_R9;
  cmatch cm;
  int prop;
  uint uStack_a54;
  char *pcStack_a50;
  bool local_a48;
  regex re;
  regex r_8;
  regex rc;
  ostringstream oss;
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing search/match");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::string((string *)&local_40,"foo",(allocator *)&oss);
  std::__cxx11::string::string((string *)&local_60,"foo",(allocator *)&cm);
  bVar1 = search(&local_40,&local_60,0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa1);
    std::operator<<(poVar4," search(\"foo\",\"foo\")");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&cm);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_80,"foo",(allocator *)&oss);
  std::__cxx11::string::string((string *)&local_a0,"foobar",(allocator *)&cm);
  bVar1 = search(&local_80,&local_a0,0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa2);
    std::operator<<(poVar4," search(\"foo\",\"foobar\")");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&cm);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_c0,"foo",(allocator *)&oss);
  std::__cxx11::string::string((string *)&local_e0,"zeefoo",(allocator *)&cm);
  bVar1 = search(&local_c0,&local_e0,0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa3);
    std::operator<<(poVar4," search(\"foo\",\"zeefoo\")");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&cm);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_100,"foo",(allocator *)&oss);
  std::__cxx11::string::string((string *)&local_120,"bar",(allocator *)&cm);
  bVar1 = search(&local_100,&local_120,0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa4);
    std::operator<<(poVar4," !search(\"foo\",\"bar\")");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&cm);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_140,"foo",(allocator *)&oss);
  std::__cxx11::string::string((string *)&local_160,"foo",(allocator *)&cm);
  bVar1 = match(&local_140,&local_160,0);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa6);
    std::operator<<(poVar4," match(\"foo\",\"foo\")");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&cm);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_180,"(http|https|ftp|mailto)",(allocator *)&oss);
  std::__cxx11::string::string((string *)&local_1a0,"https",(allocator *)&cm);
  bVar1 = match(&local_180,&local_1a0,0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa7);
    std::operator<<(poVar4," match(\"(http|https|ftp|mailto)\",\"https\")");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&cm);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_1c0,"foo",(allocator *)&oss);
  std::__cxx11::string::string((string *)&local_1e0,"zeefoo",(allocator *)&cm);
  bVar1 = match(&local_1c0,&local_1e0,0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa8);
    std::operator<<(poVar4," !match(\"foo\",\"zeefoo\")");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&cm);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_200,"foo",(allocator *)&oss);
  std::__cxx11::string::string((string *)&local_220,"foobar",(allocator *)&cm);
  bVar1 = match(&local_200,&local_220,0);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa9);
    std::operator<<(poVar4," !match(\"foo\",\"foobar\")");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&cm);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_240,"(foo)",(allocator *)&oss);
  std::__cxx11::string::string((string *)&local_260,"foo",(allocator *)&cm);
  bVar1 = match(&local_240,&local_260,0);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xaa);
    std::operator<<(poVar4," match(\"(foo)\",\"foo\")");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&cm);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_280,"(foo)",(allocator *)&oss);
  std::__cxx11::string::string((string *)&local_2a0,"zeefoo",(allocator *)&cm);
  bVar1 = match(&local_280,&local_2a0,0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xab);
    std::operator<<(poVar4," !match(\"(foo)\",\"zeefoo\")");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&cm);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_2c0,"(foo)",(allocator *)&oss);
  std::__cxx11::string::string((string *)&local_2e0,"foobar",(allocator *)&cm);
  bVar1 = match(&local_2c0,&local_2e0,0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xac);
    std::operator<<(poVar4," !match(\"(foo)\",\"foobar\")");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&cm);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_300,"((((((((((foo))))))))))",(allocator *)&oss);
  std::__cxx11::string::string((string *)&local_320,"foo",(allocator *)&cm);
  bVar1 = match(&local_300,&local_320,0);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_300);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xad);
    std::operator<<(poVar4," match(\"((((((((((foo))))))))))\",\"foo\")");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&cm);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_340,"((((((((((foo))))))))))",(allocator *)&oss);
  std::__cxx11::string::string((string *)&local_360,"foox",(allocator *)&cm);
  bVar1 = match(&local_340,&local_360,0);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_340);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xae);
    std::operator<<(poVar4," !match(\"((((((((((foo))))))))))\",\"foox\")");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&cm);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_380,"((((((((((foo))))))))))",(allocator *)&oss);
  std::__cxx11::string::string((string *)&local_3a0,"xfoo",(allocator *)&cm);
  bVar1 = match(&local_380,&local_3a0,0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xaf);
    std::operator<<(poVar4," !match(\"((((((((((foo))))))))))\",\"xfoo\")");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&cm);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_3c0,"a",(allocator *)&oss);
  std::__cxx11::string::string((string *)&local_3e0,"A",(allocator *)&cm);
  bVar1 = match(&local_3c0,&local_3e0,0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3c0);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb1);
    std::operator<<(poVar4," !match(\"a\",\"A\",0)");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&cm);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_400,"a",(allocator *)&oss);
  std::__cxx11::string::string((string *)&local_420,"xAz",(allocator *)&cm);
  bVar1 = search(&local_400,&local_420,0);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_400);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_440,"a",(allocator *)&oss);
    std::__cxx11::string::string((string *)&local_460,"A",(allocator *)&cm);
    bVar1 = match(&local_440,&local_460,0x100);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_440);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb3);
      std::operator<<(poVar4," match(\"a\",\"A\",booster::regex::icase)");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,(string *)&cm);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string((string *)&local_480,"a",(allocator *)&oss);
    std::__cxx11::string::string((string *)&local_4a0,"xAz",(allocator *)&cm);
    bVar1 = search(&local_480,&local_4a0,0x100);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_480);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb4);
      std::operator<<(poVar4," search(\"a\",\"xAz\",booster::regex::icase)");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,(string *)&cm);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar2 = booster::regex::utf8_supported();
    if (cVar2 == '\0') {
      poVar4 = std::operator<<((ostream *)&std::cout,"UTF-8 is not compiled in");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::string((string *)&local_680,".",(allocator *)&oss);
      std::__cxx11::string::string((string *)&local_6a0,"a",(allocator *)&cm);
      match(&local_680,&local_6a0,0x200);
      std::__cxx11::string::~string((string *)&local_6a0);
      std::__cxx11::string::~string((string *)&local_680);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xcf);
      std::operator<<(poVar4," match(\".\",\"a\",booster::regex::utf8)");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,(string *)&cm);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Testing UTF-8");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::string((string *)&local_4c0,".",(allocator *)&oss);
    std::__cxx11::string::string((string *)&local_4e0,anon_var_dwarf_32d4,(allocator *)&cm);
    bVar1 = match(&local_4c0,&local_4e0,0x200);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_4c0);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xba);
      std::operator<<(poVar4," match(\".\",\"\\xD7\\x90\",booster::regex::utf8)");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,(string *)&cm);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string((string *)&local_500,".",(allocator *)&oss);
    std::__cxx11::string::string((string *)&local_520,anon_var_dwarf_3300,(allocator *)&cm);
    bVar1 = match(&local_500,&local_520,0x200);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_500);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xbb);
      std::operator<<(poVar4," match(\".\",\"\\xD0\\x96\",booster::regex::utf8)");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,(string *)&cm);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string((string *)&local_540,anon_var_dwarf_3300,(allocator *)&oss);
    std::__cxx11::string::string((string *)&local_560,anon_var_dwarf_3314,(allocator *)&cm);
    bVar1 = match(&local_540,&local_560,0x300);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_540);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xbc);
      std::operator<<(poVar4,
                      " match(\"\\xD0\\x96\",\"\\xD0\\xB6\",booster::regex::icase | booster::regex::utf8)"
                     );
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,(string *)&cm);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    _prop = (char *)((ulong)uStack_a54 << 0x20);
    pcre_config(6);
    if (prop == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Unicode properties not compiled in");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::string((string *)&local_640,"\\p{Hebrew}",(allocator *)&oss);
      std::__cxx11::string::string((string *)&local_660,"a",(allocator *)&cm);
      match(&local_640,&local_660,0x200);
      std::__cxx11::string::~string((string *)&local_660);
      std::__cxx11::string::~string((string *)&local_640);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xca);
      std::operator<<(poVar4," match(\"\\\\p{Hebrew}\",\"a\",booster::regex::utf8)");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,(string *)&cm);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Testing Unicode Properties");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::string((string *)&local_580,"\\p{Hebrew}",(allocator *)&oss);
    std::__cxx11::string::string((string *)&local_5a0,anon_var_dwarf_32d4,(allocator *)&cm);
    bVar1 = match(&local_580,&local_5a0,0x200);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_580);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_5c0,"\\p{Hebrew}",(allocator *)&oss);
      std::__cxx11::string::string((string *)&local_5e0,anon_var_dwarf_3300,(allocator *)&cm);
      bVar1 = match(&local_5c0,&local_5e0,0x200);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&local_5c0);
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar4 = std::operator<<((ostream *)&oss,"Error ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xc5);
        std::operator<<(poVar4," !match(\"\\\\p{Hebrew}\",\"\\xD0\\x96\",booster::regex::utf8)");
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar5,(string *)&cm);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::string((string *)&local_600,"\\p{Hebrew}",(allocator *)&oss);
      std::__cxx11::string::string((string *)&local_620,"a",(allocator *)&cm);
      bVar1 = match(&local_600,&local_620,0x200);
      std::__cxx11::string::~string((string *)&local_620);
      std::__cxx11::string::~string((string *)&local_600);
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar4 = std::operator<<((ostream *)&oss,"Error ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xc6);
        std::operator<<(poVar4," !match(\"\\\\p{Hebrew}\",\"a\",booster::regex::utf8)");
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar5,(string *)&cm);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"Testing match_result");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::string((string *)&local_6c0,"aab",(allocator *)&oss);
      test_match<std::__cxx11::string,booster::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                (&local_6c0);
      std::__cxx11::string::~string((string *)&local_6c0);
      test_match<char_const*,booster::match_results<char_const*>>("aab");
      std::__cxx11::string::string(local_6e0,"foo",(allocator *)&oss);
      std::__cxx11::string::string(local_700,"foo",(allocator *)&cm);
      std::__cxx11::string::string(local_720,"foo",(allocator *)&prop);
      re_match((re_pattern_buffer *)0x1,(char *)local_6e0,(int)local_700,(int)local_720,
               (re_registers *)0x0);
      std::__cxx11::string::~string(local_720);
      std::__cxx11::string::~string(local_700);
      std::__cxx11::string::~string(local_6e0);
      std::__cxx11::string::string(local_740,"foo",(allocator *)&oss);
      std::__cxx11::string::string(local_760,"Foo",(allocator *)&cm);
      std::__cxx11::string::string(local_780,"",(allocator *)&prop);
      re_match((re_pattern_buffer *)0x0,(char *)local_740,(int)local_760,(int)local_780,
               (re_registers *)0x0);
      std::__cxx11::string::~string(local_780);
      std::__cxx11::string::~string(local_760);
      std::__cxx11::string::~string(local_740);
      std::__cxx11::string::string(local_7a0,"foo",(allocator *)&oss);
      std::__cxx11::string::string(local_7c0,"Foo",(allocator *)&cm);
      std::__cxx11::string::string(local_7e0,"",(allocator *)&prop);
      re_search((re_pattern_buffer *)0x0,(char *)local_7a0,(int)local_7c0,(int)local_7e0,0,in_R9);
      std::__cxx11::string::~string(local_7e0);
      std::__cxx11::string::~string(local_7c0);
      std::__cxx11::string::~string(local_7a0);
      std::__cxx11::string::string(local_800,"f.o",(allocator *)&oss);
      std::__cxx11::string::string(local_820,"foobar",(allocator *)&cm);
      std::__cxx11::string::string(local_840,"",(allocator *)&prop);
      re_match((re_pattern_buffer *)0x0,(char *)local_800,(int)local_820,(int)local_840,
               (re_registers *)0x0);
      std::__cxx11::string::~string(local_840);
      std::__cxx11::string::~string(local_820);
      std::__cxx11::string::~string(local_800);
      std::__cxx11::string::string(local_860,"f.o",(allocator *)&oss);
      std::__cxx11::string::string(local_880,"foobar",(allocator *)&cm);
      std::__cxx11::string::string(local_8a0,"foo",(allocator *)&prop);
      re_search((re_pattern_buffer *)0x1,(char *)local_860,(int)local_880,(int)local_8a0,0,in_R9);
      std::__cxx11::string::~string(local_8a0);
      std::__cxx11::string::~string(local_880);
      std::__cxx11::string::~string(local_860);
      poVar4 = std::operator<<((ostream *)&std::cout,"Testing regex match/search");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::string((string *)&oss,"foo",(allocator *)&cm);
      booster::regex::regex(&re,(string *)&oss,0);
      std::__cxx11::string::~string((string *)&oss);
      cm.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      cm.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      cm.begin_ = (char *)0x0;
      cm.end_ = (char *)0x0;
      cm.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = booster::regex_search<booster::regex>("foo",&cm,&re,0);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar4 = std::operator<<((ostream *)&oss,"Error ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xdf);
        std::operator<<(poVar4," booster::regex_search(\"foo\",cm,re)");
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar5,(string *)&prop);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      _oss = (char *)0x0;
      if ((cm.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start !=
           cm.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish) &&
         ((cm.offsets_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start)->first != 0)) {
        _oss = cm.begin_;
      }
      bVar1 = booster::operator==((sub_match<const_char_*> *)&oss,"");
      if (bVar1) {
        _prop = (char *)0x0;
        pcStack_a50 = (char *)0x0;
        local_a48 = false;
        if (cm.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start !=
            cm.offsets_.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pcStack_a50 = cm.end_;
          _prop = cm.begin_ +
                  cm.offsets_.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1].second;
          local_a48 = _prop != cm.end_;
        }
        bVar1 = booster::operator==((sub_match<const_char_*> *)&prop,"");
        if (bVar1) {
          bVar1 = booster::regex_search<booster::regex>("foobee",&cm,&re,0);
          if (!bVar1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
            poVar4 = std::operator<<((ostream *)&oss,"Error ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,":");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xe2);
            std::operator<<(poVar4," booster::regex_search(\"foobee\",cm,re)");
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar5,(string *)&prop);
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          _oss = (char *)0x0;
          if ((cm.offsets_.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start !=
               cm.offsets_.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish) &&
             ((cm.offsets_.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->first != 0)) {
            _oss = cm.begin_;
          }
          bVar1 = booster::operator==((sub_match<const_char_*> *)&oss,"");
          if (bVar1) {
            _prop = (char *)0x0;
            pcStack_a50 = (char *)0x0;
            local_a48 = false;
            if (cm.offsets_.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                cm.offsets_.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              pcStack_a50 = cm.end_;
              _prop = cm.begin_ +
                      cm.offsets_.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].second;
              local_a48 = _prop != cm.end_;
            }
            bVar1 = booster::operator==((sub_match<const_char_*> *)&prop,"bee");
            if (bVar1) {
              bVar1 = booster::regex_search<booster::regex>("zfoo",&cm,&re,0);
              if (!bVar1) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
                poVar4 = std::operator<<((ostream *)&oss,"Error ");
                poVar4 = std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                        );
                poVar4 = std::operator<<(poVar4,":");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xe5);
                std::operator<<(poVar4," booster::regex_search(\"zfoo\",cm,re)");
                prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(prVar5,(string *)&prop);
                __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              _oss = (char *)0x0;
              if ((cm.offsets_.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start !=
                   cm.offsets_.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish) &&
                 ((cm.offsets_.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start)->first != 0)) {
                _oss = cm.begin_;
              }
              bVar1 = booster::operator==((sub_match<const_char_*> *)&oss,"z");
              if (bVar1) {
                _prop = (char *)0x0;
                pcStack_a50 = (char *)0x0;
                local_a48 = false;
                if (cm.offsets_.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start !=
                    cm.offsets_.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  pcStack_a50 = cm.end_;
                  _prop = cm.begin_ +
                          cm.offsets_.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].second;
                  local_a48 = _prop != cm.end_;
                }
                bVar1 = booster::operator==((sub_match<const_char_*> *)&prop,"");
                if (bVar1) {
                  bVar1 = booster::regex_search<booster::regex>("zfoobee",&cm,&re,0);
                  if (!bVar1) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
                    poVar4 = std::operator<<((ostream *)&oss,"Error ");
                    poVar4 = std::operator<<(poVar4,
                                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                            );
                    poVar4 = std::operator<<(poVar4,":");
                    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xe8);
                    std::operator<<(poVar4," booster::regex_search(\"zfoobee\",cm,re)");
                    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::__cxx11::stringbuf::str();
                    std::runtime_error::runtime_error(prVar5,(string *)&prop);
                    __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  _oss = (char *)0x0;
                  if ((cm.offsets_.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start !=
                       cm.offsets_.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish) &&
                     ((cm.offsets_.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->first != 0)) {
                    _oss = cm.begin_;
                  }
                  bVar1 = booster::operator==((sub_match<const_char_*> *)&oss,"z");
                  if (bVar1) {
                    _prop = (char *)0x0;
                    pcStack_a50 = (char *)0x0;
                    local_a48 = false;
                    if (cm.offsets_.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start !=
                        cm.offsets_.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
                      pcStack_a50 = cm.end_;
                      _prop = cm.begin_ +
                              cm.offsets_.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].second;
                      local_a48 = _prop != cm.end_;
                    }
                    bVar1 = booster::operator==((sub_match<const_char_*> *)&prop,"bee");
                    if (bVar1) {
                      poVar4 = std::operator<<((ostream *)&std::cout,"Testing regex ctor/operator=")
                      ;
                      std::endl<char,std::char_traits<char>>(poVar4);
                      booster::regex::regex(&r_8);
                      std::__cxx11::string::string((string *)&oss,"(t(x))",(allocator *)&prop);
                      booster::regex::assign((string *)&r_8,(int)&oss);
                      std::__cxx11::string::~string((string *)&oss);
                      booster::regex::str_abi_cxx11_();
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&oss,"(t(x))");
                      std::__cxx11::string::~string((string *)&oss);
                      if (!bVar1) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
                        poVar4 = std::operator<<((ostream *)&oss,"Error ");
                        poVar4 = std::operator<<(poVar4,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                                );
                        poVar4 = std::operator<<(poVar4,":");
                        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xef);
                        std::operator<<(poVar4," r.str()==\"(t(x))\"");
                        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::__cxx11::stringbuf::str();
                        std::runtime_error::runtime_error(prVar5,(string *)&prop);
                        __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      iVar3 = booster::regex::mark_count();
                      if (iVar3 != 2) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
                        poVar4 = std::operator<<((ostream *)&oss,"Error ");
                        poVar4 = std::operator<<(poVar4,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                                );
                        poVar4 = std::operator<<(poVar4,":");
                        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xf0);
                        std::operator<<(poVar4," r.mark_count() == 2");
                        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::__cxx11::stringbuf::str();
                        std::runtime_error::runtime_error(prVar5,(string *)&prop);
                        __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      booster::regex::regex(&rc,&r_8);
                      bVar1 = booster::regex_match<booster::regex>("tx",&rc,0);
                      if (!bVar1) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
                        poVar4 = std::operator<<((ostream *)&oss,"Error ");
                        poVar4 = std::operator<<(poVar4,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                                );
                        poVar4 = std::operator<<(poVar4,":");
                        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xf2);
                        std::operator<<(poVar4," booster::regex_match(\"tx\",rc)");
                        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::__cxx11::stringbuf::str();
                        std::runtime_error::runtime_error(prVar5,(string *)&prop);
                        __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      bVar1 = booster::regex_match<booster::regex>("ty",&rc,0);
                      if (!bVar1) {
                        booster::regex::operator=(&re,&r_8);
                        bVar1 = booster::regex_match<booster::regex>("tx",&re,0);
                        if (!bVar1) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
                          poVar4 = std::operator<<((ostream *)&oss,"Error ");
                          poVar4 = std::operator<<(poVar4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                                  );
                          poVar4 = std::operator<<(poVar4,":");
                          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xf7);
                          std::operator<<(poVar4," booster::regex_match(\"tx\",re)");
                          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::__cxx11::stringbuf::str();
                          std::runtime_error::runtime_error(prVar5,(string *)&prop);
                          __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        bVar1 = booster::regex_match<booster::regex>("ty",&re,0);
                        if (!bVar1) {
                          booster::regex::~regex(&rc);
                          booster::regex::~regex(&r_8);
                          std::
                          _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                          ~_Vector_base(&cm.offsets_.
                                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       );
                          booster::regex::~regex(&re);
                          poVar4 = std::operator<<((ostream *)&std::cout,"Ok");
                          std::endl<char,std::char_traits<char>>(poVar4);
                          return 0;
                        }
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
                        poVar4 = std::operator<<((ostream *)&oss,"Error ");
                        poVar4 = std::operator<<(poVar4,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                                );
                        poVar4 = std::operator<<(poVar4,":");
                        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xf8);
                        std::operator<<(poVar4," !booster::regex_match(\"ty\",re)");
                        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::__cxx11::stringbuf::str();
                        std::runtime_error::runtime_error(prVar5,(string *)&prop);
                        __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
                      poVar4 = std::operator<<((ostream *)&oss,"Error ");
                      poVar4 = std::operator<<(poVar4,
                                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                              );
                      poVar4 = std::operator<<(poVar4,":");
                      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xf3);
                      std::operator<<(poVar4," !booster::regex_match(\"ty\",rc)");
                      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::__cxx11::stringbuf::str();
                      std::runtime_error::runtime_error(prVar5,(string *)&prop);
                      __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                  }
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
                  poVar4 = std::operator<<((ostream *)&oss,"Error ");
                  poVar4 = std::operator<<(poVar4,
                                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                          );
                  poVar4 = std::operator<<(poVar4,":");
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xe9);
                  std::operator<<(poVar4," cm.prefix()==\"z\" && cm.suffix()==\"bee\"");
                  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::stringbuf::str();
                  std::runtime_error::runtime_error(prVar5,(string *)&prop);
                  __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
              poVar4 = std::operator<<((ostream *)&oss,"Error ");
              poVar4 = std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                      );
              poVar4 = std::operator<<(poVar4,":");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xe6);
              std::operator<<(poVar4," cm.prefix()==\"z\" && cm.suffix()==\"\"");
              prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(prVar5,(string *)&prop);
              __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
          poVar4 = std::operator<<((ostream *)&oss,"Error ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xe3);
          std::operator<<(poVar4," cm.prefix()==\"\" && cm.suffix()==\"bee\"");
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar5,(string *)&prop);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xe0);
      std::operator<<(poVar4," cm.prefix()==\"\" && cm.suffix()==\"\"");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,(string *)&prop);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xc4);
    std::operator<<(poVar4," match(\"\\\\p{Hebrew}\",\"\\xD7\\x90\",booster::regex::utf8)");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,(string *)&cm);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar4 = std::operator<<((ostream *)&oss,"Error ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                          );
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb2);
  std::operator<<(poVar4," !search(\"a\",\"xAz\",0)");
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar5,(string *)&cm);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		{
			std::cout << "Testing search/match" << std::endl;
			TEST(search("foo","foo"));
			TEST(search("foo","foobar"));
			TEST(search("foo","zeefoo"));
			TEST(!search("foo","bar"));

			TEST(match("foo","foo"));
			TEST(match("(http|https|ftp|mailto)","https"));
			TEST(!match("foo","zeefoo"));
			TEST(!match("foo","foobar"));
			TEST(match("(foo)","foo"));
			TEST(!match("(foo)","zeefoo"));
			TEST(!match("(foo)","foobar"));
			TEST(match("((((((((((foo))))))))))","foo"));
			TEST(!match("((((((((((foo))))))))))","foox"));
			TEST(!match("((((((((((foo))))))))))","xfoo"));
			
			TEST(!match("a","A",0));
			TEST(!search("a","xAz",0));
			TEST(match("a","A",booster::regex::icase));
			TEST(search("a","xAz",booster::regex::icase));


			if(booster::regex::utf8_supported()) {

				std::cout << "Testing UTF-8" << std::endl;
				TEST(match(".","\xD7\x90",booster::regex::utf8));
				TEST(match(".","\xD0\x96",booster::regex::utf8));
				TEST(match("\xD0\x96","\xD0\xB6",booster::regex::icase | booster::regex::utf8));

				int prop=0;
				#ifndef BOOSTER_NO_PCRE
				pcre_config(PCRE_CONFIG_UNICODE_PROPERTIES,&prop);
				#endif
				if(prop) {
					std::cout << "Testing Unicode Properties" << std::endl;
					TEST(match("\\p{Hebrew}","\xD7\x90",booster::regex::utf8));
					TEST(!match("\\p{Hebrew}","\xD0\x96",booster::regex::utf8));
					TEST(!match("\\p{Hebrew}","a",booster::regex::utf8));
				}
				else {
					std::cout << "Unicode properties not compiled in" << std::endl;
					THROWS(match("\\p{Hebrew}","a",booster::regex::utf8),booster::regex_error);
				}
			}
			else {
				std::cout << "UTF-8 is not compiled in" << std::endl;
				THROWS(match(".","a",booster::regex::utf8),booster::regex_error);
			}
			
			std::cout << "Testing match_result" << std::endl;
			test_match<std::string,booster::smatch>("aab");
			test_match<char const *,booster::cmatch>("aab");

			re_match(true,"foo","foo","foo",0);
			re_match(false,"foo","Foo");
			re_search(false,"foo","Foo");
			re_match(false,"f.o","foobar");
			re_search(true,"f.o","foobar","foo",0);

			std::cout << "Testing regex match/search" << std::endl;
			booster::regex re("foo");
			booster::cmatch cm;
			TEST(booster::regex_search("foo",cm,re));
			TEST(cm.prefix()=="" && cm.suffix()=="");
			
			TEST(booster::regex_search("foobee",cm,re));
			TEST(cm.prefix()=="" && cm.suffix()=="bee");
			
			TEST(booster::regex_search("zfoo",cm,re));
			TEST(cm.prefix()=="z" && cm.suffix()=="");

			TEST(booster::regex_search("zfoobee",cm,re));
			TEST(cm.prefix()=="z" && cm.suffix()=="bee");

			{
				std::cout << "Testing regex ctor/operator=" << std::endl;
				booster::regex r;
				r.assign("(t(x))");
				TEST(r.str()=="(t(x))");
				TEST(r.mark_count() == 2);
				booster::regex rc(r);
				TEST(booster::regex_match("tx",rc));
				TEST(!booster::regex_match("ty",rc));

				re = r;

				TEST(booster::regex_match("tx",re));
				TEST(!booster::regex_match("ty",re));

			}

		}
	}
	catch(std::exception const &e) {
		std::cerr << "Fail: " << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}